

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::ClipControlDepthModeOneToOneTest::iterate(ClipControlDepthModeOneToOneTest *this)

{
  code *pcVar1;
  TestContext *this_00;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  qpTestResult result_00;
  TestLog *log_00;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ShaderProgram *pSVar7;
  char *pcVar8;
  TestError *this_01;
  undefined4 uStack_198;
  qpTestResult result;
  float vertex_data0 [12];
  string local_160;
  allocator<char> local_13d [13];
  string local_130;
  ProgramSources local_110;
  undefined1 local_40 [8];
  SharedPtr<glu::ShaderProgram> program;
  ClipControlApi cc;
  Functions *gl;
  TestLog *log;
  ClipControlDepthModeOneToOneTest *this_local;
  long lVar6;
  
  log_00 = tcu::TestContext::getLog
                     ((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.
                      super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  pRVar5 = deqp::Context::getRenderContext
                     ((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.
                      super_TestCase.m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  ClipControlApi::ClipControlApi
            ((ClipControlApi *)&program.m_state,
             (this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
             m_context,(this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.m_api);
  (**(code **)(lVar6 + 0x1c0))(0x3f800000,0);
  (**(code **)(lVar6 + 0x188))(0x4000);
  (**(code **)(lVar6 + 0x1c8))(0);
  (**(code **)(lVar6 + 0x188))(0x100);
  (*(code *)program.m_state)(0x8ca1,0x935e);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"ClipControl()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
                  ,0x337);
  (**(code **)(lVar6 + 0x5e0))(0xb71);
  (**(code **)(lVar6 + 0x4a0))(0x207);
  pSVar7 = (ShaderProgram *)operator_new(0xd0);
  vertex_data0[0xb]._2_1_ = 1;
  pRVar5 = deqp::Context::getRenderContext
                     ((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.
                      super_TestCase.m_context);
  pcVar8 = vsh(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,pcVar8,local_13d);
  pcVar8 = ClipControlRenderBaseTest::fsh(&this->super_ClipControlRenderBaseTest);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,pcVar8,(allocator<char> *)((long)vertex_data0 + 0x2f));
  glu::makeVtxFragSources(&local_110,&local_130,&local_160);
  glu::ShaderProgram::ShaderProgram(pSVar7,pRVar5,&local_110);
  vertex_data0[0xb]._2_1_ = 0;
  de::SharedPtr<glu::ShaderProgram>::SharedPtr((SharedPtr<glu::ShaderProgram> *)local_40,pSVar7);
  glu::ProgramSources::~ProgramSources(&local_110);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)((long)vertex_data0 + 0x2f));
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(local_13d);
  pSVar7 = de::SharedPtr<glu::ShaderProgram>::operator*((SharedPtr<glu::ShaderProgram> *)local_40);
  glu::operator<<(log_00,pSVar7);
  pSVar7 = de::SharedPtr<glu::ShaderProgram>::operator->((SharedPtr<glu::ShaderProgram> *)local_40);
  bVar2 = glu::ShaderProgram::isOk(pSVar7);
  if (!bVar2) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Program compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
               ,0x344);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lVar6 + 0x708))(1,&this->m_vao);
  (**(code **)(lVar6 + 0xd8))(this->m_vao);
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_vbo);
  vertex_data0[6] = 0.0;
  vertex_data0[7] = 1.0;
  vertex_data0[8] = 1.0;
  vertex_data0[9] = 1.0;
  vertex_data0[2] = -1.0;
  vertex_data0[3] = 0.0;
  vertex_data0[4] = -1.0;
  vertex_data0[5] = 1.0;
  uStack_198 = 0xbf800000;
  result = 0xbf800000;
  vertex_data0[0] = -1.0;
  vertex_data0[1] = 1.0;
  (**(code **)(lVar6 + 0x40))(0x8892,this->m_vbo);
  (**(code **)(lVar6 + 0x150))(0x8892,0x30,&uStack_198,0x88e4);
  (**(code **)(lVar6 + 0x19f0))(0,3,0x1406,0,0,0);
  (**(code **)(lVar6 + 0x610))(0);
  pcVar1 = *(code **)(lVar6 + 0x1680);
  pSVar7 = de::SharedPtr<glu::ShaderProgram>::operator->((SharedPtr<glu::ShaderProgram> *)local_40);
  dVar4 = glu::ShaderProgram::getProgram(pSVar7);
  (*pcVar1)(dVar4);
  (**(code **)(lVar6 + 0x538))(5,0,4);
  result_00 = ValidateFramebuffer(this,(this->super_ClipControlRenderBaseTest).
                                       super_ClipControlBaseTest.super_TestCase.m_context);
  this_00 = (this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
            super_TestCase.super_TestNode.m_testCtx;
  pcVar8 = qpGetTestResultName(result_00);
  tcu::TestContext::setTestResult(this_00,result_00,pcVar8);
  de::SharedPtr<glu::ShaderProgram>::~SharedPtr((SharedPtr<glu::ShaderProgram> *)local_40);
  return STOP;
}

Assistant:

IterateResult iterate()
	{
		tcu::TestLog&		  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		ClipControlApi		  cc(m_context, m_api);

		gl.clearColor(1.0, 0.0, 0.0, 1.0);
		gl.clear(GL_COLOR_BUFFER_BIT);

		//Clear the depth buffer to 0.5.
		gl.clearDepth(0.5);
		gl.clear(GL_DEPTH_BUFFER_BIT);

		//Set ClipControl(LOWER_LEFT, GL_NEGATIVE_ONE_TO_ONE)
		cc.clipControl(GL_LOWER_LEFT, GL_NEGATIVE_ONE_TO_ONE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ClipControl()");

		//Enable(DEPTH_TEST) with DepthFunc(ALWAYS)
		gl.enable(GL_DEPTH_TEST);
		gl.depthFunc(GL_ALWAYS);

		//Render a triangle fan coverage (-1.0,-1.0,-1.0) to (1.0,1.0,1.0).
		de::SharedPtr<glu::ShaderProgram> program(
			new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vsh(), fsh())));

		log << (*program);
		if (!program->isOk())
		{
			TCU_FAIL("Program compilation failed");
		}

		gl.genVertexArrays(1, &m_vao);
		gl.bindVertexArray(m_vao);

		gl.genBuffers(1, &m_vbo);

		const float vertex_data0[] = {
			-1.0, -1.0, -1.0, 1.0, -1.0, 0.0, -1.0, 1.0, 0.0, 1.0, 1.0, 1.0,
		};

		gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertex_data0), vertex_data0, GL_STATIC_DRAW);

		gl.vertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 0, 0);
		gl.enableVertexAttribArray(0);

		gl.useProgram(program->getProgram());

		//test method modification: use GL_TRIANGLE_STRIP, not FAN.
		gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);

		//Read back the floating-point depth buffer with ReadPixels
		//Verify that the pixels with a Z clip coordinate less than 0.0 are
		//  clipped and those coordinates from 0.0 to 1.0 update the depth
		//  buffer with values 0.0 to 1.0.
		qpTestResult result = ValidateFramebuffer(m_context);
		m_testCtx.setTestResult(result, qpGetTestResultName(result));

		return STOP;
	}